

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::SSARewriter::GenerateSSAReplacements(SSARewriter *this,BasicBlock *bb)

{
  bool bVar1;
  Op OVar2;
  Instruction *this_00;
  Op opcode;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  BasicBlock *__range2;
  BasicBlock *bb_local;
  SSARewriter *this_local;
  
  BasicBlock::begin((BasicBlock *)&__end2);
  BasicBlock::end((BasicBlock *)&inst);
  do {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&inst);
    if (!bVar1) {
      SealBlock(this,bb);
      return true;
    }
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    OVar2 = Instruction::opcode(this_00);
    if ((OVar2 == OpStore) || (OVar2 == OpVariable)) {
      ProcessStore(this,this_00,bb);
    }
    else {
      OVar2 = Instruction::opcode(this_00);
      if ((OVar2 == OpLoad) && (bVar1 = ProcessLoad(this,this_00,bb), !bVar1)) {
        return false;
      }
    }
    InstructionList::iterator::operator++(&__end2);
  } while( true );
}

Assistant:

bool SSARewriter::GenerateSSAReplacements(BasicBlock* bb) {
#if SSA_REWRITE_DEBUGGING_LEVEL > 1
  std::cerr << "Generating SSA replacements for block: " << bb->id() << "\n";
  std::cerr << bb->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES)
            << "\n";
#endif

  for (auto& inst : *bb) {
    auto opcode = inst.opcode();
    if (opcode == spv::Op::OpStore || opcode == spv::Op::OpVariable) {
      ProcessStore(&inst, bb);
    } else if (inst.opcode() == spv::Op::OpLoad) {
      if (!ProcessLoad(&inst, bb)) {
        return false;
      }
    }
  }

  // Seal |bb|. This means that all the stores in it have been scanned and
  // it's ready to feed them into its successors.
  SealBlock(bb);

#if SSA_REWRITE_DEBUGGING_LEVEL > 1
  PrintPhiCandidates();
  PrintReplacementTable();
  std::cerr << "\n\n";
#endif
  return true;
}